

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[7],pstack::JsonNull,char>
          (JObject *this,char (*k) [7],JsonNull *v,char *c)

{
  ostream *os;
  char (*local_40) [7];
  Field<char[7],_pstack::JsonNull> field;
  
  local_40 = k;
  field.k = (char (*) [7])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (JsonNull *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[7],_pstack::JsonNull>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }